

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::hitObjectNVCheck
          (TParseContext *this,TSourceLoc *loc,TType *type,TString *identifier)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_00;
  char *pcVar5;
  TStorageQualifier qualifier;
  TString *identifier_local;
  TType *type_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  iVar3 = (*type->_vptr_TType[7])();
  if ((iVar3 == 0xf) && (bVar2 = containsFieldWithBasicType(this,type,EbtHitObjectNV), bVar2)) {
    iVar3 = (*type->_vptr_TType[5])();
    pcVar5 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)CONCAT44(extraout_var,iVar3));
    pcVar4 = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (identifier);
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"struct is not allowed to contain hitObjectNV:",pcVar5,pcVar4);
  }
  else {
    iVar3 = (*type->_vptr_TType[7])();
    if (iVar3 == 0x14) {
      iVar3 = (*type->_vptr_TType[0xb])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8);
      if ((((uint)uVar1 & 0x7f) != 1) && ((uVar1 & 0x7f) != 0)) {
        pcVar5 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (identifier);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "hitObjectNV can only be declared in global or function scope with no storage qualifier:"
                   ,"hitObjectNV",pcVar5);
      }
    }
  }
  return;
}

Assistant:

void TParseContext::hitObjectNVCheck(const TSourceLoc & loc, const TType & type, const TString & identifier)
{
    if (type.getBasicType() == EbtStruct && containsFieldWithBasicType(type, EbtHitObjectNV)) {
        error(loc, "struct is not allowed to contain hitObjectNV:", type.getTypeName().c_str(), identifier.c_str());
    } else if (type.getBasicType() == EbtHitObjectNV) {
        TStorageQualifier qualifier = type.getQualifier().storage;
        if (qualifier != EvqGlobal && qualifier != EvqTemporary) {
            error(loc, "hitObjectNV can only be declared in global or function scope with no storage qualifier:", "hitObjectNV", identifier.c_str());
        }
    }
}